

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O3

void __thiscall
winmd::reader::CustomAttributeSig::CustomAttributeSig
          (CustomAttributeSig *this,table_base *table,byte_view *data,MethodDefSig *ctor)

{
  database *db;
  short *psVar1;
  pointer pPVar2;
  ushort *puVar3;
  uint8_t *puVar4;
  ushort uVar5;
  pointer ctor_param;
  anon_class_1_0_00000001 local_79;
  vector<winmd::reader::NamedArgSig,std::allocator<winmd::reader::NamedArgSig>> *local_78;
  CustomAttributeSig *local_70;
  _Variadic_union<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
  local_68;
  byte local_38;
  ulong __n;
  
  local_78 = (vector<winmd::reader::NamedArgSig,std::allocator<winmd::reader::NamedArgSig>> *)
             &this->m_named_args;
  (this->m_named_args).
  super__Vector_base<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_named_args).
  super__Vector_base<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_fixed_args).
  super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_named_args).
  super__Vector_base<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fixed_args).
  super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fixed_args).
  super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  db = table->m_database;
  local_70 = this;
  byte_view::check_available(data,2);
  psVar1 = (short *)data->m_first;
  byte_view::check_available(data,2);
  data->m_first = data->m_first + 2;
  if (*psVar1 != 1) {
    local_68._0_8_ =
         (long)&local_68._M_first._M_storage.value.
                super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
         + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"CustomAttribute blobs must start with prolog of 0x0001","");
    impl::throw_invalid((string *)&local_68._M_first);
  }
  ctor_param = (ctor->m_params).
               super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (ctor->m_params).
           super__Vector_base<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ctor_param != pPVar2) {
    do {
      FixedArgSig::read_arg((value_type *)&local_68._M_first,db,ctor_param,data);
      std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
      emplace_back<winmd::reader::FixedArgSig>
                (&local_70->m_fixed_args,(FixedArgSig *)&local_68._M_first);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>_&>
        ::_S_vtable._M_arr[local_38]._M_data)
                (&local_79,
                 (variant<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
                  *)&local_68);
      ctor_param = ctor_param + 1;
    } while (ctor_param != pPVar2);
  }
  byte_view::check_available(data,2);
  puVar3 = (ushort *)data->m_first;
  byte_view::check_available(data,2);
  puVar4 = data->m_first;
  data->m_first = puVar4 + 2;
  uVar5 = *puVar3;
  __n = (ulong)uVar5;
  if ((uint)(*(int *)&data->m_last - (int)(puVar4 + 2)) < (uint)uVar5) {
    local_68._0_8_ =
         (long)&local_68._M_first._M_storage.value.
                super__Variant_base<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Move_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
                .
                super__Copy_assign_alias<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
         + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid blob array size","");
    impl::throw_invalid((string *)&local_68._M_first);
  }
  std::vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>::reserve
            ((vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_> *)
             local_78,__n);
  while (uVar5 != 0) {
    std::vector<winmd::reader::NamedArgSig,std::allocator<winmd::reader::NamedArgSig>>::
    emplace_back<winmd::reader::database_const&,winmd::reader::byte_view&>(local_78,db,data);
    uVar5 = (short)__n - 1;
    __n = (ulong)uVar5;
  }
  return;
}

Assistant:

CustomAttributeSig(table_base const* table, byte_view& data, MethodDefSig const& ctor)
        {
            database const& db = table->get_database();
            auto const prolog = read<uint16_t>(data);
            if (prolog != 0x0001)
            {
                impl::throw_invalid("CustomAttribute blobs must start with prolog of 0x0001");
            }

            for (auto const& param : ctor.Params())
            {
                m_fixed_args.push_back(FixedArgSig{ db, param, data });
            }

            const auto num_named_args = read<uint16_t>(data);
            if (num_named_args > data.size())
            {
                impl::throw_invalid("Invalid blob array size");
            }
            m_named_args.reserve(num_named_args);

            for (uint16_t i = 0; i < num_named_args; ++i)
            {
                m_named_args.emplace_back(db, data);
            }
        }